

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGSchemaTypeHave(void *data,xmlChar *type)

{
  xmlSchemaTypePtr pxVar1;
  
  if (type != (xmlChar *)0x0) {
    pxVar1 = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    return (int)(pxVar1 != (xmlSchemaTypePtr)0x0);
  }
  return -1;
}

Assistant:

static int
xmlRelaxNGSchemaTypeHave(void *data ATTRIBUTE_UNUSED, const xmlChar * type)
{
    xmlSchemaTypePtr typ;

    if (type == NULL)
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (0);
    return (1);
}